

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLOutput.cpp
# Opt level: O1

void __thiscall Test::XMLOutput::~XMLOutput(XMLOutput *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  (this->super_CollectorOutput).super_Output._vptr_Output = (_func_int **)&PTR__XMLOutput_00133b68;
  std::__ostream_insert<char,std::char_traits<char>>(this->output,"</testsuites>\n",0xe);
  std::ostream::flush();
  pbVar1 = (this->fileStream)._M_t.
           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  (this->fileStream)._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  (this->super_CollectorOutput).super_Output._vptr_Output =
       (_func_int **)&PTR__CollectorOutput_00133530;
  std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>::
  ~vector(&(this->super_CollectorOutput).suites);
  return;
}

Assistant:

XMLOutput::~XMLOutput() noexcept {
  output << "</testsuites>\n";
  output.flush();
}